

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O0

string * __thiscall
vkt::image::getShaderImageType_abi_cxx11_
          (string *__return_storage_ptr__,image *this,TextureFormat *format,ImageType imageType,
          bool multisample)

{
  TextureChannelClass TVar1;
  char *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string imageTypePart;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string formatPart;
  bool multisample_local;
  ImageType imageType_local;
  TextureFormat *format_local;
  
  formatPart.field_2._12_4_ = SUB84(format,0);
  formatPart.field_2._M_local_buf[0xb] = (byte)imageType & 1;
  TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    local_b0 = "u";
  }
  else {
    TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
    local_b0 = "";
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      local_b0 = "i";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,local_b0,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)local_78);
  if ((formatPart.field_2._M_local_buf[0xb] & 1U) == 0) {
    switch(formatPart.field_2._12_4_) {
    case 0:
      std::__cxx11::string::operator=((string *)local_78,"1D");
      break;
    case 1:
      std::__cxx11::string::operator=((string *)local_78,"1DArray");
      break;
    case 2:
      std::__cxx11::string::operator=((string *)local_78,"2D");
      break;
    case 3:
      std::__cxx11::string::operator=((string *)local_78,"2DArray");
      break;
    case 4:
      std::__cxx11::string::operator=((string *)local_78,"3D");
      break;
    case 5:
      std::__cxx11::string::operator=((string *)local_78,"Cube");
      break;
    case 6:
      std::__cxx11::string::operator=((string *)local_78,"CubeArray");
      break;
    case 7:
      std::__cxx11::string::operator=((string *)local_78,"Buffer");
    }
  }
  else if (formatPart.field_2._12_4_ == 2) {
    std::__cxx11::string::operator=((string *)local_78,"2DMS");
  }
  else if (formatPart.field_2._12_4_ == 3) {
    std::__cxx11::string::operator=((string *)local_78,"2DMSArray");
  }
  std::operator+(&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "image");
  std::operator+(__return_storage_ptr__,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageType (const tcu::TextureFormat& format, const ImageType imageType, const bool multisample)
{
	std::string formatPart = tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER ? "u" :
							 tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER   ? "i" : "";

	std::string imageTypePart;
	if (multisample)
	{
		switch (imageType)
		{
			case IMAGE_TYPE_2D:			imageTypePart = "2DMS";			break;
			case IMAGE_TYPE_2D_ARRAY:	imageTypePart = "2DMSArray";	break;

			default:
				DE_ASSERT(false);
		}
	}
	else
	{
		switch (imageType)
		{
			case IMAGE_TYPE_1D:			imageTypePart = "1D";			break;
			case IMAGE_TYPE_1D_ARRAY:	imageTypePart = "1DArray";		break;
			case IMAGE_TYPE_2D:			imageTypePart = "2D";			break;
			case IMAGE_TYPE_2D_ARRAY:	imageTypePart = "2DArray";		break;
			case IMAGE_TYPE_3D:			imageTypePart = "3D";			break;
			case IMAGE_TYPE_CUBE:		imageTypePart = "Cube";			break;
			case IMAGE_TYPE_CUBE_ARRAY:	imageTypePart = "CubeArray";	break;
			case IMAGE_TYPE_BUFFER:		imageTypePart = "Buffer";		break;

			default:
				DE_ASSERT(false);
		}
	}

	return formatPart + "image" + imageTypePart;
}